

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall foxxll::config::initialize(config *this)

{
  long lVar1;
  long *__dest;
  size_type __dnew;
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  long local_1a0;
  Logger local_198;
  
  tlx::Logger::Logger(&local_198);
  local_1a0 = 0x4b;
  local_1c0 = local_1b0;
  __dest = (long *)std::__cxx11::string::_M_create((ulong *)&local_1c0,(ulong)&local_1a0);
  lVar1 = local_1a0;
  local_1b0[0] = local_1a0;
  local_1c0 = __dest;
  memcpy(__dest,"FOXXLL v1.4.99 (prerelease/) (git a4a8aeee64743f845c5851e8b089965ea1c219d7)",0x4b);
  local_1b8 = lVar1;
  *(undefined1 *)((long)__dest + lVar1) = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,(char *)local_1c0,lVar1);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  tlx::Logger::~Logger(&local_198);
  print_library_version_mismatch();
  this->first_flash = 0;
  if ((this->disks_list).
      super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->disks_list).
      super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
      super__Vector_impl_data._M_start) {
    (*this->_vptr_config[2])(this);
  }
  this->max_device_id_ = 0;
  this->is_initialized = true;
  return;
}

Assistant:

void config::initialize()
{
    TLX_LOG1 << get_version_string_long();
    print_library_version_mismatch();

    first_flash = 0;

    // if disks_list is empty, then try to load disk configuration files
    if (disks_list.size() == 0)
    {
        find_config();
    }

    max_device_id_ = 0;

    is_initialized = true;
}